

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O1

shared_ptr<libtorrent::aux::torrent> __thiscall
libtorrent::aux::session_impl::delay_load_torrent
          (session_impl *this,info_hash_t *info_hash,peer_connection *pc)

{
  _Atomic_word *p_Var1;
  int *piVar2;
  add_torrent_params *this_00;
  _func_int *p_Var3;
  char cVar4;
  int iVar5;
  long in_RCX;
  peer_connection *extraout_RDX;
  peer_connection *extraout_RDX_00;
  _func_int **pp_Var6;
  bool bVar7;
  shared_ptr<libtorrent::aux::torrent> sVar8;
  error_code ec;
  torrent_handle handle;
  add_torrent_params p;
  undefined4 local_3d0;
  uint uStack_3cc;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_3c8;
  session_impl *local_3c0;
  undefined8 local_3b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_3b0;
  undefined1 local_3a8 [888];
  
  pp_Var6 = *(_func_int ***)(info_hash[0xa0].v2.m_number._M_elems + 7);
  local_3a8._24_8_ = *(undefined8 *)(info_hash[0xa1].v1.m_number._M_elems + 1);
  bVar7 = pp_Var6 == (_func_int **)local_3a8._24_8_;
  local_3c0 = this;
  if (!bVar7) {
    this_00 = (add_torrent_params *)(local_3a8 + 0x28);
    local_3a8._16_8_ = info_hash;
    local_3a8._32_8_ = pc;
    do {
      add_torrent_params::add_torrent_params(this_00);
      p_Var3 = *pp_Var6;
      ::std::__shared_ptr<libtorrent::aux::peer_connection,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<libtorrent::aux::peer_connection,void>
                ((__shared_ptr<libtorrent::aux::peer_connection,(__gnu_cxx::_Lock_policy)2> *)
                 &local_3d0,
                 (__weak_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2> *)
                 (in_RCX + 0x88));
      local_3b8 = CONCAT44(uStack_3cc,local_3d0);
      if (local_3c8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_3c8->_M_weak_count = local_3c8->_M_weak_count + 1;
          UNLOCK();
        }
        else {
          local_3c8->_M_weak_count = local_3c8->_M_weak_count + 1;
        }
      }
      local_3b0 = local_3c8;
      cVar4 = (**(code **)(*(long *)p_Var3 + 0x40))(p_Var3,local_3a8._32_8_,&local_3b8,this_00);
      if (local_3b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var1 = &local_3b0->_M_weak_count;
          iVar5 = *p_Var1;
          *p_Var1 = *p_Var1 + -1;
          UNLOCK();
        }
        else {
          iVar5 = local_3b0->_M_weak_count;
          local_3b0->_M_weak_count = iVar5 + -1;
        }
        if (iVar5 == 1) {
          (*local_3b0->_vptr__Sp_counted_base[3])();
        }
      }
      if (local_3c8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3c8);
      }
      if (cVar4 == '\0') {
        add_torrent_params::~add_torrent_params(this_00);
        pc = extraout_RDX;
      }
      else {
        local_3d0 = 0;
        uStack_3cc = uStack_3cc & 0xffffff00;
        local_3c8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    &boost::system::detail::cat_holder<void>::system_category_instance;
        add_torrent((session_impl *)local_3a8,(add_torrent_params *)local_3a8._16_8_,
                    (error_code *)this_00);
        torrent_handle::native_handle((torrent_handle *)local_3c0);
        if ((_func_int **)local_3a8._8_8_ != (_func_int **)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            piVar2 = (int *)(local_3a8._8_8_ + 0xc);
            iVar5 = *piVar2;
            *piVar2 = *piVar2 + -1;
            UNLOCK();
          }
          else {
            iVar5 = *(int *)(local_3a8._8_8_ + 0xc);
            *(int *)(local_3a8._8_8_ + 0xc) = iVar5 + -1;
          }
          if (iVar5 == 1) {
            (**(code **)(*(_func_int **)local_3a8._8_8_ + 0x18))();
          }
        }
        add_torrent_params::~add_torrent_params(this_00);
        pc = extraout_RDX_00;
        if (cVar4 != '\0') {
          if (!bVar7) goto LAB_002d1452;
          break;
        }
      }
      pp_Var6 = pp_Var6 + 2;
      bVar7 = pp_Var6 == (_func_int **)local_3a8._24_8_;
    } while (!bVar7);
  }
  (local_3c0->super_session_interface).super_session_logger._vptr_session_logger = (_func_int **)0x0
  ;
  (local_3c0->super_dht_observer).super_dht_logger._vptr_dht_logger = (_func_int **)0x0;
LAB_002d1452:
  sVar8.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pc;
  sVar8.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_3c0;
  return (shared_ptr<libtorrent::aux::torrent>)
         sVar8.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<torrent> session_impl::delay_load_torrent(info_hash_t const& info_hash
		, peer_connection* pc)
	{
#ifndef TORRENT_DISABLE_EXTENSIONS
		for (auto& e : m_ses_extensions[plugins_all_idx])
		{
			add_torrent_params p;
			if (e->on_unknown_torrent(info_hash, peer_connection_handle(pc->self()), p))
			{
				error_code ec;
				torrent_handle handle = add_torrent(std::move(p), ec);

				return handle.native_handle();
			}
		}
#else
		TORRENT_UNUSED(pc);
		TORRENT_UNUSED(info_hash);
#endif
		return std::shared_ptr<torrent>();
	}